

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int subb_a_imm(em8051 *aCPU)

{
  int iVar1;
  int carry;
  em8051 *aCPU_local;
  
  iVar1 = (int)(aCPU->mSFR[0x50] & 0x80) >> 7;
  sub_solve_flags(aCPU,(uint)aCPU->mSFR[0x60],
                  (uint)aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)] + iVar1);
  aCPU->mSFR[0x60] =
       aCPU->mSFR[0x60] -
       (aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)] + (char)iVar1);
  aCPU->mPC = aCPU->mPC + 2;
  return 0;
}

Assistant:

static int subb_a_imm(struct em8051 *aCPU)
{
    int carry = CARRY;
    sub_solve_flags(aCPU, ACC, OPERAND1 + carry);
    ACC -= OPERAND1 + carry;
    PC += 2;
    return 0;
}